

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool __thiscall SyncScanner::isHeaderPCH(SyncScanner *this,string *headerFilename)

{
  int iVar1;
  size_type sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  long in_FS_OFFSET;
  string *__str;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  allocator<char> local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (isHeaderPCH(std::__cxx11::string_const&)::pchSuffix_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&isHeaderPCH(std::__cxx11::string_const&)::pchSuffix_abi_cxx11_);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_RSI,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      std::allocator<char>::~allocator(&local_9);
      __cxa_atexit(std::__cxx11::string::~string,
                   &isHeaderPCH(std::__cxx11::string_const&)::pchSuffix_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&isHeaderPCH(std::__cxx11::string_const&)::pchSuffix_abi_cxx11_);
    }
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size(in_RSI);
  __str = &isHeaderPCH(std::__cxx11::string_const&)::pchSuffix_abi_cxx11_;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
            (&isHeaderPCH(std::__cxx11::string_const&)::pchSuffix_abi_cxx11_);
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),__str,
                     (size_type)in_RSI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return sVar2 != 0xffffffffffffffff;
  }
  __stack_chk_fail();
}

Assistant:

[[nodiscard]] bool isHeaderPCH(const std::string &headerFilename)
    {
        static const std::string pchSuffix("_pch.h");
        return headerFilename.find(pchSuffix, headerFilename.size() - pchSuffix.size())
                != std::string::npos;
    }